

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O0

void __thiscall
eos::fitting::RenderingParameters::RenderingParameters
          (RenderingParameters *this,ScaledOrthoProjectionParameters *ortho_params,int screen_width,
          int screen_height)

{
  Frustum local_40;
  float local_30;
  undefined4 local_2c;
  float t;
  float b;
  float r;
  float l;
  int screen_height_local;
  int screen_width_local;
  ScaledOrthoProjectionParameters *ortho_params_local;
  RenderingParameters *this_local;
  
  this->camera_type = Orthographic;
  r = (float)screen_height;
  l = (float)screen_width;
  _screen_height_local = ortho_params;
  ortho_params_local = (ScaledOrthoProjectionParameters *)this;
  Frustum::Frustum(&this->frustum);
  Eigen::Quaternion<float,_0>::Quaternion(&this->rotation);
  this->t_x = ortho_params->tx;
  this->t_y = ortho_params->ty;
  std::optional<float>::optional(&this->t_z);
  std::optional<float>::optional(&this->fov_y);
  this->screen_width = (int)l;
  this->screen_height = (int)r;
  Eigen::QuaternionBase<Eigen::Quaternion<float,0>>::operator=
            ((QuaternionBase<Eigen::Quaternion<float,0>> *)&this->rotation,
             (MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)ortho_params);
  b = 0.0;
  t = (float)(int)l / ortho_params->s;
  local_2c = 0;
  local_30 = (float)(int)r / ortho_params->s;
  Frustum::Frustum(&local_40,0.0,t,0.0,local_30);
  (this->frustum).l = local_40.l;
  (this->frustum).r = local_40.r;
  (this->frustum).b = local_40.b;
  (this->frustum).t = local_40.t;
  return;
}

Assistant:

RenderingParameters(ScaledOrthoProjectionParameters ortho_params, int screen_width, int screen_height)
        : camera_type(CameraType::Orthographic), t_x(ortho_params.tx), t_y(ortho_params.ty),
          screen_width(screen_width), screen_height(screen_height)
    {
        rotation = ortho_params.R; // converts the rotation matrix to a quaternion

        const float l = 0.0f;
        const float r = screen_width / ortho_params.s;
        const float b = 0.0f; // The b and t values are not tested for what happens if the SOP parameters
        const float t = screen_height / ortho_params.s; // were estimated on a non-flipped viewport.
        frustum = Frustum(l, r, b, t);
    }